

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcResub.c
# Opt level: O2

void Abc_CutFactor_rec(Abc_Obj_t *pObj,Vec_Ptr_t *vLeaves)

{
  uint uVar1;
  int iVar2;
  
  while( true ) {
    if ((*(uint *)&pObj->field_0x14 & 0x10) != 0) {
      return;
    }
    uVar1 = *(uint *)&pObj->field_0x14 & 0xf;
    if (((uVar1 == 2) || (uVar1 == 5)) ||
       ((1 < (pObj->vFanouts).nSize && (iVar2 = Abc_NodeIsMuxControlType(pObj), iVar2 == 0))))
    break;
    Abc_CutFactor_rec((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray],vLeaves);
    pObj = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[1]];
  }
  Vec_PtrPush(vLeaves,pObj);
  pObj->field_0x14 = pObj->field_0x14 | 0x10;
  return;
}

Assistant:

void Abc_CutFactor_rec( Abc_Obj_t * pObj, Vec_Ptr_t * vLeaves )
{
    if ( pObj->fMarkA )
        return;
    if ( Abc_ObjIsCi(pObj) || (Abc_ObjFanoutNum(pObj) > 1 && !Abc_NodeIsMuxControlType(pObj)) )
    {
        Vec_PtrPush( vLeaves, pObj );
        pObj->fMarkA = 1;
        return;
    }
    Abc_CutFactor_rec( Abc_ObjFanin0(pObj), vLeaves );
    Abc_CutFactor_rec( Abc_ObjFanin1(pObj), vLeaves );
}